

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O0

int TeleportRead(int stream,float *samples,int numsamples)

{
  bool bVar1;
  SharedMemoryHandle *this;
  SharedMemory *pSVar2;
  int local_2c;
  int n;
  Stream *s;
  int numsamples_local;
  float *samples_local;
  int stream_local;
  
  this = Teleport::GetSharedMemory();
  pSVar2 = Teleport::SharedMemoryHandle::operator->(this);
  for (local_2c = 0; local_2c < numsamples; local_2c = local_2c + 1) {
    bVar1 = Teleport::Stream::Read(pSVar2->streams + stream,samples + local_2c);
    if (!bVar1) {
      samples[local_2c] = 0.0;
    }
  }
  return pSVar2->streams[stream].readpos;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int TeleportRead(int stream, float* samples, int numsamples)
{
    Teleport::Stream& s = Teleport::GetSharedMemory()->streams[stream];
    for (int n = 0; n < numsamples; n++)
        if (!s.Read(samples[n]))
            samples[n] = 0.0f;
    return s.readpos;
}